

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Branch * __thiscall
CFG::Relooper::AddBranch(Relooper *this,Expression *ConditionInit,Expression *CodeInit)

{
  pointer pBVar1;
  Branch *branchPtr;
  __single_object branch;
  Expression *CodeInit_local;
  Expression *ConditionInit_local;
  Relooper *this_local;
  
  branch._M_t.super___uniq_ptr_impl<CFG::Branch,_std::default_delete<CFG::Branch>_>._M_t.
  super__Tuple_impl<0UL,_CFG::Branch_*,_std::default_delete<CFG::Branch>_>.
  super__Head_base<0UL,_CFG::Branch_*,_false>._M_head_impl =
       (__uniq_ptr_data<CFG::Branch,_std::default_delete<CFG::Branch>,_true,_true>)
       (__uniq_ptr_data<CFG::Branch,_std::default_delete<CFG::Branch>,_true,_true>)CodeInit;
  CodeInit_local = ConditionInit;
  ConditionInit_local = (Expression *)this;
  std::make_unique<CFG::Branch,wasm::Expression*&,wasm::Expression*&>
            ((Expression **)&branchPtr,&CodeInit_local);
  pBVar1 = std::unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_>::get
                     ((unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_> *)&branchPtr);
  std::
  deque<std::unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_>,_std::allocator<std::unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_>_>_>
  ::push_back(&this->Branches,
              (unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_> *)&branchPtr);
  std::unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_>::~unique_ptr
            ((unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_> *)&branchPtr);
  return pBVar1;
}

Assistant:

Branch* Relooper::AddBranch(wasm::Expression* ConditionInit,
                            wasm::Expression* CodeInit) {
  auto branch = std::make_unique<Branch>(ConditionInit, CodeInit);
  auto* branchPtr = branch.get();
  Branches.push_back(std::move(branch));
  return branchPtr;
}